

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O0

int __thiscall CVmMT19937::rand(CVmMT19937 *this)

{
  uint uVar1;
  uint32_t y;
  
  if (0x26f < this->idx) {
    generate_untempered(this);
    this->idx = 0;
  }
  uVar1 = this->mt[this->idx] >> 0xb ^ this->mt[this->idx];
  uVar1 = (uVar1 & 0x13a58ad) << 7 ^ uVar1;
  uVar1 = (uVar1 & 0x1df8c) << 0xf ^ uVar1;
  this->idx = this->idx + 1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

uint32_t rand()
    {
        /* if we're out of untempered numbers, generate the next set */
        if (idx >= NMT)
        {
            generate_untempered();
            idx = 0;
        }

        /* generate a tempered result */
        uint32_t y = mt[idx];
        y ^= (y >> 11);
        y ^= ((y << 7) & 0x9d2c5680);
        y ^= ((y << 15) & 0xefc60000);
        y ^= (y >> 18);

        /* on to the next index */
        ++idx;

        /* return the result */
        return y;
    }